

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O0

void jsons_print_revisions(lyout *out,lys_revision *rev,uint8_t rev_size,int *first)

{
  char *pcVar1;
  bool bVar2;
  int local_30;
  int local_2c;
  int f;
  int i;
  int *first_local;
  lys_revision *plStack_18;
  uint8_t rev_size_local;
  lys_revision *rev_local;
  lyout *out_local;
  
  if (rev_size != '\0') {
    bVar2 = false;
    if (first != (int *)0x0) {
      bVar2 = *first != 0;
    }
    pcVar1 = ",";
    if (bVar2) {
      pcVar1 = "";
    }
    _f = first;
    first_local._7_1_ = rev_size;
    plStack_18 = rev;
    rev_local = (lys_revision *)out;
    ly_print(out,"%s\"revision\":{",pcVar1);
    for (local_2c = 0; local_2c < (int)(uint)first_local._7_1_; local_2c = local_2c + 1) {
      pcVar1 = "";
      if (local_2c != 0) {
        pcVar1 = ",";
      }
      ly_print((lyout *)rev_local,"%s\"%s\":{",pcVar1,plStack_18 + local_2c);
      local_30 = 1;
      jsons_print_text((lyout *)rev_local,"description","text",plStack_18[local_2c].dsc,1,&local_30)
      ;
      jsons_print_text((lyout *)rev_local,"reference","text",plStack_18[local_2c].ref,1,&local_30);
      ly_print((lyout *)rev_local,"}");
    }
    ly_print((lyout *)rev_local,"}");
    if (_f != (int *)0x0) {
      *_f = 0;
    }
  }
  return;
}

Assistant:

static void
jsons_print_revisions(struct lyout *out, const struct lys_revision *rev, uint8_t rev_size, int *first)
{
    int i, f;

    if (!rev_size) {
        return;
    }

    ly_print(out, "%s\"revision\":{", (first && (*first)) ? "" : ",");
    for (i = 0; i < rev_size; ++i) {
        ly_print(out, "%s\"%s\":{", i ? "," : "", rev[i].date);
        f = 1;
        jsons_print_text(out, "description", "text", rev[i].dsc, 1, &f);
        jsons_print_text(out, "reference", "text", rev[i].ref, 1, &f);
        ly_print(out, "}");
    }
    ly_print(out, "}");
    if (first) {
        (*first) = 0;
    }
}